

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial_device.cpp
# Opt level: O2

Vec3fa embree::getTextureTexel3f(Texture *texture,float s,float t)

{
  ushort uVar1;
  uint uVar2;
  undefined1 uVar3;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  float fVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  uint *in_RSI;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 in_XMM0_Be;
  undefined1 uVar31;
  undefined1 extraout_XMM0_Be;
  undefined1 in_XMM0_Bf;
  undefined1 uVar32;
  undefined1 extraout_XMM0_Bf;
  undefined1 in_XMM0_Bg;
  undefined1 uVar33;
  undefined1 extraout_XMM0_Bg;
  undefined1 in_XMM0_Bh;
  undefined1 uVar34;
  undefined1 extraout_XMM0_Bh;
  undefined4 uVar35;
  float fVar36;
  undefined4 in_XMM1_Db;
  undefined8 uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  Vec3fa VVar52;
  undefined2 uVar4;
  undefined3 uVar5;
  undefined4 uVar6;
  undefined5 uVar7;
  undefined6 uVar8;
  undefined7 uVar9;
  undefined8 uVar10;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar48 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar49 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  uVar37 = CONCAT44(in_XMM1_Db,t);
  uVar27 = 0;
  uVar28 = 0;
  uVar29 = 0;
  uVar30 = 0;
  uVar19 = CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be))) ^
           CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be)));
  uVar31 = (undefined1)uVar19;
  uVar32 = (undefined1)(uVar19 >> 8);
  uVar33 = (undefined1)(uVar19 >> 0x10);
  uVar34 = (undefined1)(uVar19 >> 0x18);
  uVar35 = 0;
  if ((in_RSI != (uint *)0x0) && (in_RSI[2] == 1)) {
    uVar19 = *in_RSI;
    uVar2 = in_RSI[1];
    fVar36 = floorf((float)uVar2 * t);
    uVar35 = (undefined4)((ulong)uVar37 >> 0x20);
    fVar18 = floorf((float)uVar19 * s);
    lVar26 = (long)(int)(((((int)((uint)(int)fVar36 % uVar2) >> 0x1f & uVar2) +
                          (uint)(int)fVar36 % uVar2) * uVar19 +
                         ((int)((uint)(int)fVar18 % uVar19) >> 0x1f & uVar19) +
                         (uint)(int)fVar18 % uVar19) * 4);
    fVar36 = (float)*(byte *)(*(long *)(in_RSI + 6) + lVar26) / 255.0;
    uVar37 = CONCAT44(uVar35,fVar36);
    uVar1 = *(ushort *)(*(long *)(in_RSI + 6) + 1 + lVar26);
    uVar19 = CONCAT13(extraout_XMM0_Bh,
                      CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be))) ^
             CONCAT13(extraout_XMM0_Bh,
                      CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be)));
    auVar46._0_15_ = ZEXT415(0);
    auVar46[0xf] = (char)(uVar19 >> 0x18);
    auVar45._14_2_ = auVar46._14_2_;
    auVar45._0_13_ = ZEXT413(0);
    auVar45[0xd] = (char)(uVar19 >> 0x10);
    auVar44._13_3_ = auVar45._13_3_;
    auVar44._0_13_ = ZEXT413(0);
    auVar43._12_4_ = auVar44._12_4_;
    auVar43._0_11_ = ZEXT411(0);
    auVar43[0xb] = (char)(uVar19 >> 8);
    auVar42._11_5_ = auVar43._11_5_;
    auVar42._0_11_ = ZEXT411(0);
    auVar41._10_6_ = auVar42._10_6_;
    auVar41._0_9_ = (unkuint9)0;
    auVar41[9] = (char)uVar19;
    auVar40._9_7_ = auVar41._9_7_;
    auVar40._0_9_ = (unkuint9)0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auVar40._8_8_;
    auVar21._9_7_ = 0;
    auVar21._0_9_ = SUB169(auVar22 << 0x40,7);
    auVar20._10_6_ = 0;
    auVar20._0_10_ = SUB1610(auVar21 << 0x38,6);
    auVar51._11_5_ = 0;
    auVar51._0_11_ = SUB1611(auVar20 << 0x30,5);
    auVar25._12_4_ = 0;
    auVar25._0_12_ = SUB1612(auVar51 << 0x28,4);
    auVar39._3_13_ = SUB1613(auVar25 << 0x20,3);
    auVar39[2] = (char)(uVar1 >> 8);
    auVar39._0_2_ = uVar1;
    auVar38._2_14_ = auVar39._2_14_;
    auVar38._0_2_ = uVar1 & 0xff;
    auVar49._0_12_ = auVar38._0_12_;
    auVar49._12_2_ = 0;
    auVar49._14_2_ = (short)(uVar19 >> 0x10);
    auVar48._12_4_ = auVar49._12_4_;
    auVar48._0_10_ = auVar38._0_10_;
    auVar48._10_2_ = (short)uVar19;
    auVar47._10_6_ = auVar48._10_6_;
    auVar47._0_10_ = (unkuint10)0;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar47._8_8_;
    auVar23._2_10_ = SUB1610(auVar24 << 0x40,6);
    auVar23._0_2_ = auVar39._2_2_;
    auVar50._0_4_ = (float)auVar38._0_2_;
    auVar50._4_4_ = (float)auVar23._0_4_;
    auVar50._8_4_ = (float)auVar47._8_4_;
    auVar50._12_4_ = (float)auVar48._12_4_;
    auVar51 = divps(auVar50,_DAT_00222f40);
    uVar35 = auVar51._4_4_;
    uVar27 = SUB41(fVar36,0);
    uVar28 = (undefined1)((uint)fVar36 >> 8);
    uVar29 = (undefined1)((uint)fVar36 >> 0x10);
    uVar30 = (undefined1)((uint)fVar36 >> 0x18);
    uVar31 = auVar51[0];
    uVar32 = auVar51[1];
    uVar33 = auVar51[2];
    uVar34 = auVar51[3];
  }
  uVar11 = uVar28;
  uVar3 = uVar27;
  uVar4 = CONCAT11(uVar11,uVar3);
  uVar12 = uVar29;
  uVar5 = CONCAT12(uVar12,uVar4);
  uVar13 = uVar30;
  uVar6 = CONCAT13(uVar13,uVar5);
  uVar14 = uVar31;
  uVar7 = CONCAT14(uVar14,uVar6);
  uVar15 = uVar32;
  uVar8 = CONCAT15(uVar15,uVar7);
  uVar16 = uVar33;
  uVar9 = CONCAT16(uVar16,uVar8);
  uVar17 = uVar34;
  uVar10 = CONCAT17(uVar17,uVar9);
  texture->width = uVar6;
  texture->height = (int)((ulong)uVar10 >> 0x20);
  texture->format = uVar35;
  texture->bytesPerTexel = 0;
  VVar52.field_0._1_1_ = uVar28;
  VVar52.field_0._0_1_ = uVar27;
  VVar52.field_0._2_1_ = uVar29;
  VVar52.field_0._3_1_ = uVar30;
  VVar52.field_0._4_1_ = uVar31;
  VVar52.field_0._5_1_ = uVar32;
  VVar52.field_0._6_1_ = uVar33;
  VVar52.field_0._7_1_ = uVar34;
  VVar52.field_0._8_8_ = uVar37;
  return (Vec3fa)VVar52.field_0;
}

Assistant:

Vec3fa getTextureTexel3f(const Texture* texture, float s, float t)
{
  if (!texture) return Vec3fa(0.0f,0.0f,0.0f);

  int iu = (int)floor(s * (float)(texture->width));
  iu = iu % texture->width; if (iu < 0) iu += texture->width;
  int iv = (int)floor(t * (float)(texture->height));
  iv = iv % texture->height; if (iv < 0) iv += texture->height;

  if (texture->format == Texture::RGBA8)
  {
    const int offset = (iv * texture->width + iu) * 4;
    unsigned char * t = (unsigned char*)texture->data;
    const unsigned char  r = t[offset+0];
    const unsigned char  g = t[offset+1];
    const unsigned char  b = t[offset+2];
    return Vec3fa(  (float)r * 1.0f/255.0f, (float)g * 1.0f/255.0f, (float)b * 1.0f/255.0f );
  }
  return Vec3fa(0.0f,0.0f,0.0f);
}